

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

XmlWriter * __thiscall Catch::XmlWriter::endElement(XmlWriter *this,XmlFormatting fmt)

{
  bool bVar1;
  ostream *poVar2;
  reference pvVar3;
  string local_38 [36];
  XmlFormatting local_14;
  XmlWriter *pXStack_10;
  XmlFormatting fmt_local;
  XmlWriter *this_local;
  
  local_14 = fmt;
  pXStack_10 = this;
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)local_38,(ulong)&this->m_indent);
  std::__cxx11::string::operator=((string *)&this->m_indent,local_38);
  std::__cxx11::string::~string(local_38);
  if ((this->m_tagIsOpen & 1U) == 0) {
    newlineIfNecessary(this);
    bVar1 = anon_unknown_1::shouldIndent(local_14);
    if (bVar1) {
      std::operator<<((ostream *)this->m_os,(string *)&this->m_indent);
    }
    poVar2 = std::operator<<((ostream *)this->m_os,"</");
    pvVar3 = CLI::std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&this->m_tags);
    poVar2 = std::operator<<(poVar2,(string *)pvVar3);
    std::operator<<(poVar2,">");
  }
  else {
    std::operator<<((ostream *)this->m_os,"/>");
    this->m_tagIsOpen = false;
  }
  std::ostream::operator<<(this->m_os,std::flush<char,std::char_traits<char>>);
  applyFormatting(this,local_14);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&this->m_tags);
  return this;
}

Assistant:

XmlWriter& XmlWriter::endElement(XmlFormatting fmt) {
        m_indent = m_indent.substr(0, m_indent.size() - 2);

        if( m_tagIsOpen ) {
            m_os << "/>";
            m_tagIsOpen = false;
        } else {
            newlineIfNecessary();
            if (shouldIndent(fmt)) {
                m_os << m_indent;
            }
            m_os << "</" << m_tags.back() << ">";
        }
        m_os << std::flush;
        applyFormatting(fmt);
        m_tags.pop_back();
        return *this;
    }